

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRSInterface.cpp
# Opt level: O3

void * RazorAHRSInterfaceThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  char *__s_00;
  timespec local_40;
  
  if ((szRazorAHRSInterfacePath[0] == ':') &&
     (iVar3 = atoi(szRazorAHRSInterfacePath + 1), 0 < iVar3)) {
    RazorAHRSInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar3 = LaunchMultiCliTCPSrv
                        (szRazorAHRSInterfacePath + 1,handlerazorahrsinterfacecli,(void *)0x0);
      if (iVar3 == 0) goto LAB_00196684;
      puts("Error launching the RazorAHRSInterface server.");
      local_40.tv_sec = 4;
      local_40.tv_nsec = 0;
      nanosleep(&local_40,(timespec *)0x0);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    __s = "RazorAHRSInterface disconnection failed.";
    do {
      if (bVar1) {
        iVar3 = handlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
        if (iVar3 == 0) {
          bVar1 = true;
          bVar2 = false;
        }
        else {
          puts("Connection to a RazorAHRSInterface lost.");
          iVar3 = CloseRS232Port(&RazorAHRSInterfacePseudoRS232Port);
          __s_00 = "RazorAHRSInterface disconnection failed.";
          if (iVar3 == 0) {
            __s_00 = "RazorAHRSInterface disconnected.";
          }
          puts(__s_00);
          local_40.tv_sec = 0;
          local_40.tv_nsec = 15000000;
LAB_00196615:
          bVar1 = false;
          nanosleep(&local_40,(timespec *)0x0);
          bVar2 = true;
        }
      }
      else {
        iVar3 = connectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
        if (iVar3 != 0) {
          local_40.tv_sec = 1;
          local_40.tv_nsec = 0;
          goto LAB_00196615;
        }
        local_40.tv_sec = 0;
        local_40.tv_nsec = 15000000;
        bVar2 = false;
        nanosleep(&local_40,(timespec *)0x0);
        bVar1 = true;
      }
    } while (bExit == 0);
    if (!bVar2) {
      iVar3 = CloseRS232Port(&RazorAHRSInterfacePseudoRS232Port);
      if (iVar3 == 0) {
        __s = "RazorAHRSInterface disconnected.";
      }
      puts(__s);
LAB_00196684:
      if (bExit == 0) {
        bExit = 1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(razorahrsinterfacefilename, LOG_FOLDER"razorahrsinterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//razorahrsinterfacefile = fopen(razorahrsinterfacefilename, "w");
	//if (razorahrsinterfacefile == NULL)
	//{
	//	printf("Unable to create razorahrsinterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szRazorAHRSInterfacePath[0] == ':')&&(atoi(szRazorAHRSInterfacePath+1) > 0))
	{
		RazorAHRSInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szRazorAHRSInterfacePath+1, handlerazorahrsinterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the RazorAHRSInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*15);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("RazorAHRSInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*15);
					bConnected = TRUE; 

					inithandlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlerazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a RazorAHRSInterface lost.\n");
					bConnected = FALSE;
					disconnectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
					uSleep(1000*15);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectrazorahrsinterface(&RazorAHRSInterfacePseudoRS232Port);
	}

	//fclose(razorahrsinterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}